

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  bool bVar13;
  ulong uVar14;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      iVar12 = 0;
      do {
        uVar11 = *(ulong *)((long)ldata + lVar7 + -8);
        if (uVar11 == *(ulong *)((long)rdata + lVar7 + -8)) {
          pvVar3 = *(void **)((long)&ldata->value + lVar7);
          pvVar4 = *(void **)((long)&rdata->value + lVar7);
          bVar13 = true;
          if ((pvVar3 != pvVar4) &&
             (((uint)uVar11 < 0xd || (iVar5 = bcmp(pvVar3,pvVar4,uVar11 & 0xffffffff), iVar5 != 0)))
             ) goto LAB_00e3771c;
        }
        else {
LAB_00e3771c:
          bVar13 = false;
        }
        result_data[iVar12] = bVar13;
        iVar12 = iVar12 + 1;
        lVar7 = lVar7 + 0x10;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar2 = puVar1[uVar9];
      uVar8 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar8 = count;
      }
      uVar6 = uVar8;
      if (uVar2 != 0) {
        uVar6 = uVar11;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar11 < uVar8) {
            uVar11 = uVar11 << 4 | 8;
            do {
              uVar2 = *(ulong *)((long)ldata + (uVar11 - 8));
              if (uVar2 == *(ulong *)((long)rdata + (uVar11 - 8))) {
                pvVar3 = *(void **)((long)&ldata->value + uVar11);
                pvVar4 = *(void **)((long)&rdata->value + uVar11);
                bVar13 = true;
                if ((pvVar3 != pvVar4) &&
                   (((uint)uVar2 < 0xd ||
                    (iVar5 = bcmp(pvVar3,pvVar4,uVar2 & 0xffffffff), iVar5 != 0))))
                goto LAB_00e37638;
              }
              else {
LAB_00e37638:
                bVar13 = false;
              }
              result_data[uVar6] = bVar13;
              uVar6 = uVar6 + 1;
              uVar11 = uVar11 + 0x10;
            } while (uVar8 != uVar6);
          }
        }
        else if (uVar11 < uVar8) {
          uVar10 = uVar11 << 4 | 8;
          uVar14 = 0;
          do {
            if ((uVar2 >> (uVar14 & 0x3f) & 1) != 0) {
              uVar6 = *(ulong *)((long)ldata + (uVar10 - 8));
              if (uVar6 == *(ulong *)((long)rdata + (uVar10 - 8))) {
                pvVar3 = *(void **)((long)&ldata->value + uVar10);
                pvVar4 = *(void **)((long)&rdata->value + uVar10);
                bVar13 = true;
                if ((pvVar3 != pvVar4) &&
                   (((uint)uVar6 < 0xd ||
                    (iVar5 = bcmp(pvVar3,pvVar4,uVar6 & 0xffffffff), iVar5 != 0))))
                goto LAB_00e376a5;
              }
              else {
LAB_00e376a5:
                bVar13 = false;
              }
              result_data[uVar11] = bVar13;
            }
            uVar11 = uVar11 + 1;
            uVar10 = uVar10 + 0x10;
            uVar14 = uVar14 + 1;
            uVar6 = uVar11;
          } while (uVar8 != uVar11);
        }
      }
      uVar9 = uVar9 + 1;
      uVar11 = uVar6;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}